

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1556.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  headerinfo info;
  undefined8 local_30;
  
  local_30 = 0;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                  ,0x34,iVar2,uVar4);
  }
  if (iVar2 == 0) {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                    ,0x36);
      iVar2 = 0x7c;
    }
    else {
      iVar3 = curl_easy_setopt(lVar5,0x4e6f,header);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                      ,0x38,iVar3,uVar4);
        iVar2 = iVar3;
      }
      if (iVar2 == 0) {
        iVar3 = curl_easy_setopt(lVar5,0x272d,&local_30);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                        ,0x39,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 == 0) {
          iVar3 = curl_easy_setopt(lVar5,0x29,1);
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                          ,0x3a,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 == 0) {
            iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                            ,0x3b,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 == 0) {
              iVar2 = curl_easy_perform(lVar5);
              uVar1 = _stderr;
              if (iVar2 == 0) {
                iVar2 = 0;
                curl_mprintf("Max: %ld\n",local_30);
              }
              else {
                uVar4 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                              ,0x41,iVar2,uVar4);
                iVar2 = 0x7e;
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar5);
    curl_global_cleanup();
  }
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURLcode code;
  CURL *curl = NULL;
  int res = 0;
  struct headerinfo info = {0};

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_HEADERFUNCTION, header);
  easy_setopt(curl, CURLOPT_HEADERDATA, &info);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_URL, URL);

  code = curl_easy_perform(curl);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  printf("Max: %ld\n", (long)info.largest);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}